

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_srar_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  ulong uVar1;
  byte bVar2;
  int64_t r_bit;
  int32_t b_arg2;
  int64_t arg2_local;
  int64_t arg1_local;
  int64_t iStack_10;
  uint32_t df_local;
  
  uVar1 = (ulong)arg2 % (ulong)(1L << ((char)df + 3U & 0x3f));
  iStack_10 = arg1;
  if ((int)uVar1 != 0) {
    bVar2 = (byte)uVar1;
    iStack_10 = (arg1 >> (bVar2 & 0x3f)) + (arg1 >> (bVar2 - 1 & 0x3f) & 1U);
  }
  return iStack_10;
}

Assistant:

static inline int64_t msa_srar_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int32_t b_arg2 = BIT_POSITION(arg2, df);
    if (b_arg2 == 0) {
        return arg1;
    } else {
        int64_t r_bit = (arg1 >> (b_arg2 - 1)) & 1;
        return (arg1 >> b_arg2) + r_bit;
    }
}